

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# codegen.cpp
# Opt level: O3

statement_base * __thiscall
cs::method_until::translate_end
          (method_until *this,method_base *method,context_t *context,
          deque<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>,_std::allocator<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>_>_>
          *raw,deque<cs::token_base_*,_std::allocator<cs::token_base_*>_> *code)

{
  int iVar1;
  reference pptVar2;
  statement_base *psVar3;
  compile_error *this_00;
  string local_38;
  
  if (method != (method_base *)0x0) {
    iVar1 = (*method->_vptr_method_base[3])(method);
    if (iVar1 == 0x11) {
      pptVar2 = std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>::at(code,1);
      psVar3 = method_loop::translate
                         ((method_loop *)code,context,raw,
                          (tree_type<cs::token_base_*> *)(*pptVar2 + 1));
      return psVar3;
    }
  }
  this_00 = (compile_error *)__cxa_allocate_exception(0x28);
  local_38._M_dataplus._M_p = (pointer)&local_38.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_38,"Use until in non-loop statement.","");
  compile_error::compile_error(this_00,&local_38);
  __cxa_throw(this_00,&compile_error::typeinfo,compile_error::~compile_error);
}

Assistant:

statement_base *method_until::translate_end(method_base *method, const context_t &context,
	        std::deque<std::deque<token_base *>> &raw,
	        std::deque<token_base *> &code)
	{
		if (method != nullptr && method->get_target_type() == statement_types::loop_)
			return static_cast<method_loop *>(method)->translate(context, raw,
			        static_cast<token_expr *>(code.at(1))->get_tree());
		else
			throw compile_error("Use until in non-loop statement.");
	}